

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * print_value(cJSON *item,int depth,int fmt,printbuffer *p)

{
  byte bVar1;
  char *pcVar2;
  
  if (item == (cJSON *)0x0) {
    return (char *)0x0;
  }
  bVar1 = (byte)item->type;
  if (p == (printbuffer *)0x0) {
    if (0xf < bVar1) {
      if (bVar1 == 0x10) {
        pcVar2 = item->valuestring;
        p = (printbuffer *)0x0;
        goto LAB_00102d36;
      }
      if (bVar1 == 0x20) {
        p = (printbuffer *)0x0;
        goto LAB_00102d3e;
      }
      if (bVar1 != 0x40) {
        return (char *)0x0;
      }
      p = (printbuffer *)0x0;
      goto LAB_00102cba;
    }
    switch(bVar1) {
    case 1:
      pcVar2 = (char *)(*cJSON_malloc)(6);
      break;
    case 2:
      pcVar2 = (char *)(*cJSON_malloc)(5);
      goto LAB_00102d1b;
    default:
      goto switchD_00102c33_caseD_3;
    case 4:
      pcVar2 = (char *)(*cJSON_malloc)(5);
      goto LAB_00102cf7;
    case 8:
      p = (printbuffer *)0x0;
      goto LAB_00102d0a;
    }
  }
  else {
    if (0xf < bVar1) {
      if (bVar1 == 0x10) {
        pcVar2 = item->valuestring;
LAB_00102d36:
        pcVar2 = print_string_ptr(pcVar2,p);
        return pcVar2;
      }
      if (bVar1 == 0x20) {
LAB_00102d3e:
        pcVar2 = print_array(item,depth,fmt,p);
        return pcVar2;
      }
      if (bVar1 != 0x40) {
        return (char *)0x0;
      }
LAB_00102cba:
      pcVar2 = print_object(item,depth,fmt,p);
      return pcVar2;
    }
    switch(bVar1) {
    case 1:
      pcVar2 = ensure(p,6);
      break;
    case 2:
      pcVar2 = ensure(p,5);
LAB_00102d1b:
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      builtin_strncpy(pcVar2,"true",5);
      return pcVar2;
    default:
      goto switchD_00102c33_caseD_3;
    case 4:
      pcVar2 = ensure(p,5);
LAB_00102cf7:
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      builtin_strncpy(pcVar2,"null",5);
      return pcVar2;
    case 8:
LAB_00102d0a:
      pcVar2 = print_number(item,p);
      return pcVar2;
    }
  }
  if (pcVar2 != (char *)0x0) {
    builtin_strncpy(pcVar2,"false",6);
    return pcVar2;
  }
switchD_00102c33_caseD_3:
  return (char *)0x0;
}

Assistant:

static char *print_value(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char *out=0;
	if (!item) return 0;
	if (p)
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	{out=ensure(p,5);	if (out) strcpy(out,"null");	break;}
			case cJSON_False:	{out=ensure(p,6);	if (out) strcpy(out,"false");	break;}
			case cJSON_True:	{out=ensure(p,5);	if (out) strcpy(out,"true");	break;}
			case cJSON_Number:	out=print_number(item,p);break;
			case cJSON_String:	out=print_string(item,p);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,p);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,p);break;
		}
	}
	else
	{
		switch ((item->type)&255)
		{
			case cJSON_NULL:	out=cJSON_strdup("null");	break;
			case cJSON_False:	out=cJSON_strdup("false");break;
			case cJSON_True:	out=cJSON_strdup("true"); break;
			case cJSON_Number:	out=print_number(item,0);break;
			case cJSON_String:	out=print_string(item,0);break;
			case cJSON_Array:	out=print_array(item,depth,fmt,0);break;
			case cJSON_Object:	out=print_object(item,depth,fmt,0);break;
		}
	}
	return out;
}